

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O1

Instr * __thiscall
Inline::InlineBuiltInFunction
          (Inline *this,Instr *callInstr,FunctionJITTimeInfo *inlineeData,OpCode inlineCallOpCode,
          FunctionJITTimeInfo *inlinerData,StackSym *symCallerThis,bool *pIsInlined,uint profileId,
          uint recursiveInlineDepth,Instr *funcObjCheckInsertInstr)

{
  _func_int **pp_Var1;
  Func *pFVar2;
  Func *func;
  code *pcVar3;
  bool bVar4;
  BuiltinFunction BVar5;
  OpndKind OVar6;
  byte bVar7;
  ArgSlot AVar8;
  OpCode OVar9;
  uint uVar10;
  BuiltInFlags flags;
  int iVar11;
  RegSlot RVar12;
  RegSlot RVar13;
  undefined4 *puVar14;
  Instr *pIVar15;
  char16 *inlineeName;
  FunctionJITTimeInfo *topFunc;
  StackSym *pSVar16;
  ByteCodeUsesInstr *pBVar17;
  StackSym *pSVar18;
  SymOpnd *dstOpnd;
  Opnd *pOVar19;
  Opnd *src2Opnd;
  Instr *pIVar20;
  RegOpnd *pRVar21;
  Instr *pIVar22;
  Opnd *pOVar23;
  AddrOpnd *src2Opnd_00;
  RegOpnd *opnd;
  _func_int *p_Var24;
  FunctionJITTimeInfo *inlineeData_00;
  Inline *this_00;
  Instr *pIVar25;
  Opnd *local_68;
  
  if (callInstr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar14 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x804,"(callInstr)","callInstr");
    if (!bVar4) goto LAB_0054a656;
    *puVar14 = 0;
  }
  if (inlinerData == (FunctionJITTimeInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar14 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x805,"(inlinerData)","inlinerData");
    if (!bVar4) goto LAB_0054a656;
    *puVar14 = 0;
  }
  if (inlineCallOpCode == EndOfBlock) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar14 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x806,"(inlineCallOpCode != 0)","inlineCallOpCode != 0");
    if (!bVar4) goto LAB_0054a656;
    *puVar14 = 0;
  }
  *pIsInlined = false;
  uVar10 = FunctionJITTimeInfo::GetLocalFunctionId(inlineeData);
  BVar5 = Js::JavascriptLibrary::GetBuiltInForFuncInfo(uVar10);
  bVar4 = CanInlineBuiltInFunction
                    (this,callInstr,inlineeData_00,inlineCallOpCode,inlinerData,BVar5,false);
  if (bVar4) {
    flags = Js::JavascriptLibrary::GetFlagsForBuiltIn(BVar5);
    pOVar23 = callInstr->m_src2;
    OVar6 = IR::Opnd::GetKind(pOVar23);
    if (OVar6 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar14 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar4) goto LAB_0054a656;
      *puVar14 = 0;
    }
    pSVar16 = (StackSym *)pOVar23[1]._vptr_Opnd;
    if ((pSVar16->super_Sym).m_kind != SymKindStack) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar14 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
      if (!bVar4) goto LAB_0054a656;
      *puVar14 = 0;
    }
    AVar8 = StackSym::GetArgSlotNum(pSVar16);
    iVar11 = (AVar8 - 1) + (uint)((flags >> 0xc & 1) != 0);
    if (inlineCallOpCode == InlineFunctionApply) {
      pIVar15 = InlineApply(this,callInstr,inlineeData,inlinerData,symCallerThis,pIsInlined,
                            profileId,recursiveInlineDepth,iVar11 - (uint)((flags >> 0xc & 1) != 0))
      ;
      return pIVar15;
    }
    if ((inlineCallOpCode & ~ExtendedOpcodePrefix) == InlineFunctionCall) {
      pIVar15 = InlineCall(this,callInstr,inlineeData,inlinerData,symCallerThis,pIsInlined,profileId
                           ,recursiveInlineDepth,inlineCallOpCode == InlineCallInstanceFunction);
      return pIVar15;
    }
    inlineeName = Js::JavascriptLibrary::GetNameForBuiltIn(BVar5);
    topFunc = JITTimeWorkItem::GetJITTimeInfo(this->topFunc->m_workItem);
    bVar4 = JITTimeWorkItem::IsLoopBody(callInstr->m_func->topFunc->m_workItem);
    TraceInlining(inlinerData,inlineeName,(char16 *)0x0,0,topFunc,0,(FunctionJITTimeInfo *)0x0,
                  profileId,bVar4,(uint)BVar5._value);
    *pIsInlined = true;
    pSVar16 = IR::Opnd::GetStackSym(callInstr->m_src1);
    bVar7 = callInstr->m_src1->field_0xb;
    pBVar17 = EmitFixedMethodOrFunctionObjectChecksForBuiltIns
                        (this,callInstr,funcObjCheckInsertInstr,inlineeData,false,true,false,true);
    if (inlineCallOpCode == CallDirect) {
      pSVar18 = SymTable::GetArgSlotSym(callInstr->m_func->m_symTable,1);
      dstOpnd = IR::SymOpnd::New(&pSVar18->super_Sym,0,TyUint64,callInstr->m_func);
      pOVar19 = IR::Instr::UnlinkSrc1(callInstr);
      src2Opnd = IR::Instr::UnlinkSrc2(callInstr);
      pIVar15 = IR::Instr::New(ArgOut_A_InlineSpecialized,&dstOpnd->super_Opnd,pOVar19,src2Opnd,
                               callInstr->m_func);
      IR::Instr::SetByteCodeOffset(pIVar15,callInstr);
      pIVar20 = IR::Instr::GetInsertBeforeByteCodeUsesInstr(callInstr);
      IR::Instr::InsertBefore(pIVar20,pIVar15);
      uVar10 = FunctionJITTimeInfo::GetLocalFunctionId(inlineeData);
      this_00 = (Inline *)(ulong)uVar10;
      BVar5 = Js::JavascriptLibrary::GetBuiltInForFuncInfo(uVar10);
      callInstr->m_opcode = CallDirect;
      SetupInlineInstrForCallDirect(this_00,BVar5,callInstr,pIVar15);
      WrapArgsOutWithCoerse(this_00,BVar5,callInstr);
      IR::Instr::MoveArgs(callInstr,true);
      pIVar15 = callInstr;
    }
    else {
      pIVar15 = InsertInlineeBuiltInStartEndTags(this,callInstr,(uint)AVar8,(Instr **)0x0);
      if (inlineCallOpCode == InlineArrayPop) {
        pIVar15->m_opcode = InlineNonTrackingBuiltInEnd;
      }
    }
    if (pBVar17 != (ByteCodeUsesInstr *)0x0) {
      IR::Instr::Unlink(&pBVar17->super_Instr);
      IR::Instr::InsertBefore(callInstr,&pBVar17->super_Instr);
    }
    bVar4 = Js::JavascriptLibrary::IsTypeSpecRequired(flags);
    if (bVar4) {
      OVar9 = pIVar15->m_opcode;
      pIVar20 = pIVar15;
      while (OVar9 != InlineBuiltInStart) {
        pIVar20 = pIVar20->m_prev;
        OVar9 = pIVar20->m_opcode;
      }
      local_68 = callInstr->m_dst;
      if (inlineCallOpCode == InlineArrayPop || local_68 == (Opnd *)0x0) {
        if (1 < (ushort)(inlineCallOpCode - InlineArrayPop)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar14 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                             ,0x873,
                             "(inlineCallOpCode == Js::OpCode::InlineArrayPush || inlineCallOpCode == Js::OpCode::InlineArrayPop)"
                             ,"Currently Dst can be null only for InlineArrayPush/InlineArrayPop");
          if (!bVar4) goto LAB_0054a656;
          *puVar14 = 0;
        }
        pRVar21 = (RegOpnd *)0x0;
      }
      else {
        pSVar18 = StackSym::New(local_68->m_type,callInstr->m_func);
        pRVar21 = IR::RegOpnd::New(pSVar18,pSVar18->m_type,callInstr->m_func);
        local_68 = IR::Instr::UnlinkDst(callInstr);
        IR::Instr::SetDst(callInstr,&pRVar21->super_Opnd);
      }
      pIVar22 = IR::Instr::GetPrevRealInstrOrLabel(callInstr);
      pBVar17 = IR::ByteCodeUsesInstr::New(pIVar22);
      IR::ByteCodeUsesInstr::SetRemovedOpndSymbol
                (pBVar17,(bool)((bVar7 & 8) >> 3),(pSVar16->super_Sym).m_id);
      pIVar22 = pIVar15;
      if (inlineCallOpCode == InlineArrayPop) {
        pIVar22 = callInstr;
      }
      IR::Instr::InsertBefore(pIVar22,&pBVar17->super_Instr);
      if (pRVar21 != (RegOpnd *)0x0) {
        OVar9 = Func::GetLoadOpForType(local_68->m_type);
        pIVar22 = IR::Instr::New(OVar9,local_68,&pRVar21->super_Opnd,callInstr->m_func);
        IR::Instr::InsertBefore(pIVar15,pIVar22);
      }
      IR::Instr::UnlinkSrc1(callInstr);
      IR::Instr::UnlinkSrc2(callInstr);
      callInstr->m_opcode = inlineCallOpCode;
      pBVar17 = IR::ByteCodeUsesInstr::New(callInstr);
      pSVar16 = IR::Opnd::GetStackSym(pIVar15->m_src2);
      if (((pSVar16->field_0x18 & 1) == 0) || ((pSVar16->field_5).m_instrDef == (Instr *)0x0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar14 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x1af,"(linkSym->IsSingleDef())","linkSym->IsSingleDef()");
        if (!bVar4) goto LAB_0054a656;
        *puVar14 = 0;
      }
      pIVar22 = (pSVar16->field_5).m_instrDef;
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      do {
        if ((pIVar22->m_src2 == (Opnd *)0x0) ||
           (OVar6 = IR::Opnd::GetKind(pIVar22->m_src2), OVar6 != OpndKindSym)) {
LAB_00549f1d:
          pIVar25 = (Instr *)0x0;
        }
        else {
          pOVar19 = pIVar22->m_src2;
          OVar6 = IR::Opnd::GetKind(pOVar19);
          if (OVar6 != OpndKindSym) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar14 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                               ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
            if (!bVar4) goto LAB_0054a656;
            *puVar14 = 0;
          }
          pp_Var1 = pOVar19[1]._vptr_Opnd;
          if (*(char *)((long)pp_Var1 + 0x14) != '\x01') {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar14 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                               ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
            if (!bVar4) goto LAB_0054a656;
            *puVar14 = 0;
          }
          if (((*(byte *)((long)pp_Var1 + 0x1a) & 0x10) != 0) &&
             (*(short *)((long)pp_Var1 + 0x16) == 0)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar14 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                               ,0x5b,"(this->m_slotNum != 0)","this->m_slotNum != 0");
            if (!bVar4) goto LAB_0054a656;
            *puVar14 = 0;
          }
          if ((*(byte *)((long)pp_Var1 + 0x1a) & 0x10) == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar14 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                               ,0x1b8,"(linkSym->IsArgSlotSym())","linkSym->IsArgSlotSym()");
            if (!bVar4) goto LAB_0054a656;
            *puVar14 = 0;
          }
          if ((((((ulong)pp_Var1[3] & 1) == 0) || (pp_Var1[5] == (_func_int *)0x0)) &&
              (bVar4 = Func::IsInPhase(pIVar15->m_func,FGPeepsPhase), !bVar4)) &&
             (bVar4 = Func::IsInPhase(pIVar15->m_func,FGBuildPhase), !bVar4)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar14 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                               ,0x1bf,
                               "(linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase)))"
                               ,
                               "linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase))"
                              );
            if (!bVar4) goto LAB_0054a656;
            *puVar14 = 0;
          }
          if (((ulong)pp_Var1[3] & 1) == 0) goto LAB_00549f1d;
          pIVar25 = (Instr *)pp_Var1[5];
        }
        if (pIVar22->m_opcode != ArgOut_A_InlineSpecialized) {
          if (pIVar22->m_opcode == StartCall) {
            if (pIVar25 != (Instr *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar14 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                                 ,0x1ce,"(nextArg == nullptr)","nextArg == nullptr");
              if (!bVar4) goto LAB_0054a656;
              *puVar14 = 0;
            }
            break;
          }
          pSVar16 = IR::Opnd::GetStackSym(pOVar23);
          pSVar16->field_0x19 = pSVar16->field_0x19 | 0x50;
          bVar4 = OpCodeAttr::BailOutRec(inlineCallOpCode);
          if (bVar4) {
            pSVar16 = IR::Opnd::GetStackSym(pIVar22->m_src1);
            if (((*(uint *)&pSVar16->field_0x18 >> 0xd & 1) != 0) &&
               (((((*(uint *)&pSVar16->field_0x18 & 1) == 0 ||
                  (pOVar23 = ((pSVar16->field_5).m_instrDef)->m_src1, pOVar23 == (Opnd *)0x0)) ||
                 ((((OVar6 = IR::Opnd::GetKind(pOVar23), OVar6 != OpndKindIntConst &&
                    ((OVar6 = IR::Opnd::GetKind(pOVar23), OVar6 != OpndKindInt64Const &&
                     (OVar6 = IR::Opnd::GetKind(pOVar23), OVar6 != OpndKindAddr)))) &&
                   (OVar6 = IR::Opnd::GetKind(pOVar23), OVar6 != OpndKindHelperCall)) &&
                  ((OVar6 = IR::Opnd::GetKind(pOVar23), OVar6 != OpndKindFloatConst &&
                   (OVar6 = IR::Opnd::GetKind(pOVar23), OVar6 != OpndKindSimd128Const)))))) &&
                ((pSVar16->field_0x1a & 4) == 0)))) {
              RVar12 = StackSym::GetByteCodeRegSlot(pSVar16);
              pSVar16 = IR::Opnd::GetStackSym(local_68);
              RVar13 = StackSym::GetByteCodeRegSlot(pSVar16);
              if (RVar12 != RVar13) {
                IR::ByteCodeUsesInstr::Set(pBVar17,pIVar22->m_src1);
              }
            }
          }
          pIVar22->m_opcode = ArgOut_A_InlineBuiltIn;
          IR::Instr::GenerateBytecodeArgOutCapture(pIVar22);
          pOVar23 = pIVar22->m_src1;
          if (iVar11 == 1) {
            if (callInstr->m_src1 != (Opnd *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar14 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                 ,0x16c,"(this->m_src1 == __null)",
                                 "Trying to overwrite existing src.");
              if (!bVar4) goto LAB_0054a656;
              *puVar14 = 0;
            }
            pFVar2 = callInstr->m_func;
            if (pOVar23->isDeleted == true) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar14 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                 ,0x14,"(!isDeleted)","Using deleted operand");
              if (!bVar4) goto LAB_0054a656;
              *puVar14 = 0;
            }
            bVar7 = pOVar23->field_0xb;
            if ((bVar7 & 2) != 0) {
              pOVar23 = IR::Opnd::Copy(pOVar23,pFVar2);
              bVar7 = pOVar23->field_0xb;
            }
            pOVar23->field_0xb = bVar7 | 2;
            callInstr->m_src1 = pOVar23;
LAB_0054a1c9:
            IR::Opnd::SetIsJITOptimizedReg(pOVar23,true);
          }
          else if (iVar11 == 2) {
            if (callInstr->m_src2 != (Opnd *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar14 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                 ,0x18b,"(this->m_src2 == __null)",
                                 "Trying to overwrite existing src.");
              if (!bVar4) goto LAB_0054a656;
              *puVar14 = 0;
            }
            pFVar2 = callInstr->m_func;
            if (pOVar23->isDeleted == true) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar14 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                 ,0x14,"(!isDeleted)","Using deleted operand");
              if (!bVar4) goto LAB_0054a656;
              *puVar14 = 0;
            }
            bVar7 = pOVar23->field_0xb;
            if ((bVar7 & 2) != 0) {
              pOVar23 = IR::Opnd::Copy(pOVar23,pFVar2);
              bVar7 = pOVar23->field_0xb;
            }
            pOVar23->field_0xb = bVar7 | 2;
            callInstr->m_src2 = pOVar23;
            goto LAB_0054a1c9;
          }
          iVar11 = iVar11 + -1;
          pOVar23 = pIVar22->m_src2;
          IR::Instr::Move(pIVar22,pIVar20);
          pIVar20 = pIVar22;
        }
        pIVar22 = pIVar25;
      } while (pIVar25 != (Instr *)0x0);
      if ((inlineCallOpCode == InlineMathImul) || (inlineCallOpCode == InlineMathClz)) {
        pFVar2 = callInstr->m_func;
        src2Opnd_00 = IR::AddrOpnd::NewFromNumber(0,pFVar2,true);
        pRVar21 = IR::RegOpnd::New(TyVar,pFVar2);
        IR::Opnd::SetIsJITOptimizedReg(&pRVar21->super_Opnd,true);
        pOVar19 = IR::Instr::UnlinkSrc1(callInstr);
        pIVar20 = IR::Instr::New(Or_A,&pRVar21->super_Opnd,pOVar19,&src2Opnd_00->super_Opnd,pFVar2);
        IR::Instr::SetByteCodeOffset(pIVar20,callInstr);
        IR::Instr::InsertBefore(callInstr,pIVar20);
        if (callInstr->m_src1 != (Opnd *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar14 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
          if (!bVar4) goto LAB_0054a656;
          *puVar14 = 0;
        }
        func = callInstr->m_func;
        if ((pRVar21->super_Opnd).isDeleted == true) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar14 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x14,"(!isDeleted)","Using deleted operand");
          if (!bVar4) goto LAB_0054a656;
          *puVar14 = 0;
        }
        bVar7 = (pRVar21->super_Opnd).field_0xb;
        opnd = pRVar21;
        if ((bVar7 & 2) != 0) {
          opnd = (RegOpnd *)IR::Opnd::Copy(&pRVar21->super_Opnd,func);
          bVar7 = (opnd->super_Opnd).field_0xb;
        }
        (opnd->super_Opnd).field_0xb = bVar7 | 2;
        callInstr->m_src1 = &opnd->super_Opnd;
        if (inlineCallOpCode == InlineMathImul) {
          bVar4 = IR::Opnd::IsEqual(callInstr->m_src2,&opnd->super_Opnd);
          if (bVar4) {
            IR::Instr::ReplaceSrc2(callInstr,&pRVar21->super_Opnd);
          }
          else {
            pRVar21 = IR::RegOpnd::New(TyVar,pFVar2);
            IR::Opnd::SetIsJITOptimizedReg(&pRVar21->super_Opnd,true);
            pOVar19 = IR::Instr::UnlinkSrc2(callInstr);
            pIVar20 = IR::Instr::New(Or_A,&pRVar21->super_Opnd,pOVar19,&src2Opnd_00->super_Opnd,
                                     pFVar2);
            IR::Instr::SetByteCodeOffset(pIVar20,callInstr);
            IR::Instr::InsertBefore(callInstr,pIVar20);
            IR::Instr::SetSrc2(callInstr,&pRVar21->super_Opnd);
          }
        }
      }
      bVar4 = OpCodeAttr::BailOutRec(inlineCallOpCode);
      if (bVar4) {
        IR::Instr::InsertBefore(pIVar15,&pBVar17->super_Instr);
      }
      OVar6 = IR::Opnd::GetKind(pOVar23);
      if (OVar6 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar14 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar4) goto LAB_0054a656;
        *puVar14 = 0;
      }
      if (((ulong)pOVar23[1]._vptr_Opnd[3] & 1) == 0) {
        p_Var24 = (_func_int *)0x0;
      }
      else {
        p_Var24 = pOVar23[1]._vptr_Opnd[5];
      }
      if (*(short *)(p_Var24 + 0x30) != 7) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar14 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                           ,0x8ea,
                           "(linkOpnd->AsRegOpnd()->m_sym->GetInstrDef()->m_opcode == Js::OpCode::StartCall)"
                           ,
                           "linkOpnd->AsRegOpnd()->m_sym->GetInstrDef()->m_opcode == Js::OpCode::StartCall"
                          );
        if (!bVar4) goto LAB_0054a656;
        *puVar14 = 0;
      }
      OVar6 = IR::Opnd::GetKind(pOVar23);
      if (OVar6 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar14 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar4) goto LAB_0054a656;
        *puVar14 = 0;
      }
      pIVar20 = (Instr *)0x0;
      if (((ulong)pOVar23[1]._vptr_Opnd[3] & 1) != 0) {
        pIVar20 = (Instr *)pOVar23[1]._vptr_Opnd[5];
      }
      uVar10 = IR::Instr::GetArgOutCount(pIVar20,false);
      if (uVar10 != AVar8) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar14 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                           ,0x8eb,
                           "(linkOpnd->AsRegOpnd()->m_sym->GetInstrDef()->GetArgOutCount( false) == actualCount)"
                           ,
                           "linkOpnd->AsRegOpnd()->m_sym->GetInstrDef()->GetArgOutCount( false) == actualCount"
                          );
        if (!bVar4) goto LAB_0054a656;
        *puVar14 = 0;
      }
      OVar6 = IR::Opnd::GetKind(pOVar23);
      if (OVar6 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar14 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar4) {
LAB_0054a656:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar14 = 0;
      }
      *(uint *)(pOVar23[1]._vptr_Opnd + 3) = *(uint *)(pOVar23[1]._vptr_Opnd + 3) | 0x4000;
      bVar4 = OpCodeAttr::BailOutRec(inlineCallOpCode);
      if (bVar4) {
        IR::Instr::ConvertToBailOutInstr(callInstr,callInstr,BailOutOnFloor,0xffffffff);
      }
    }
    pIVar15 = pIVar15->m_next;
  }
  else {
    pIVar15 = callInstr->m_next;
  }
  return pIVar15;
}

Assistant:

IR::Instr *
Inline::InlineBuiltInFunction(
    IR::Instr *callInstr,
    const FunctionJITTimeInfo * inlineeData,
    Js::OpCode inlineCallOpCode,
    const FunctionJITTimeInfo * inlinerData, 
    const StackSym *symCallerThis, 
    bool* pIsInlined, 
    uint profileId, 
    uint recursiveInlineDepth, 
    IR::Instr * funcObjCheckInsertInstr)
{
    Assert(callInstr);
    Assert(inlinerData);
    Assert(inlineCallOpCode != 0);

    // We may still decide not to inline.
    *pIsInlined = false;

    // Inlining is profile-based, so get the built-in function from profile rather than from the callInstr's opnd.
    Js::BuiltinFunction builtInId = Js::JavascriptLibrary::GetBuiltInForFuncInfo(inlineeData->GetLocalFunctionId());
    if (!CanInlineBuiltInFunction(callInstr, inlineeData, inlineCallOpCode, inlinerData, builtInId, false))
    {
        return callInstr->m_next;
    }

    Js::BuiltInFlags builtInFlags = Js::JavascriptLibrary::GetFlagsForBuiltIn(builtInId);
    IR::Opnd * linkOpnd = callInstr->GetSrc2();
    Js::ArgSlot actualCount = linkOpnd->AsSymOpnd()->m_sym->AsStackSym()->GetArgSlotNum();

    bool usesThisArgument = (builtInFlags & Js::BuiltInFlags::BIF_UseSrc0) != 0;
    int inlineCallArgCount = (int)(usesThisArgument ? actualCount : actualCount - 1);

    IR::Instr *inlineBuiltInEndInstr = nullptr;
    if (inlineCallOpCode == Js::OpCode::InlineFunctionApply)
    {
        return InlineApply(callInstr, inlineeData, inlinerData, symCallerThis, pIsInlined, profileId, recursiveInlineDepth, inlineCallArgCount - (usesThisArgument ? 1 : 0));
    }

    if (inlineCallOpCode == Js::OpCode::InlineFunctionCall || inlineCallOpCode == Js::OpCode::InlineCallInstanceFunction)
    {
        const bool isCallInstanceFunction = (inlineCallOpCode == Js::OpCode::InlineCallInstanceFunction);
        return InlineCall(callInstr, inlineeData, inlinerData, symCallerThis, pIsInlined, profileId, recursiveInlineDepth, isCallInstanceFunction);
    }

#if defined(ENABLE_DEBUG_CONFIG_OPTIONS)
    TraceInlining(inlinerData, Js::JavascriptLibrary::GetNameForBuiltIn(builtInId),
        nullptr, 0, this->topFunc->GetWorkItem()->GetJITTimeInfo(), 0, nullptr, profileId, callInstr->m_func->GetTopFunc()->IsLoopBody(), builtInId);
#endif

    // From now on we are committed to inlining.
    *pIsInlined = true;

    // Save off the call target operand (function object) so we can extend its lifetime as needed, even if
    // the call instruction gets transformed to CallIFixed.
    StackSym* originalCallTargetStackSym = callInstr->GetSrc1()->GetStackSym();
    bool originalCallTargetOpndIsJITOpt = callInstr->GetSrc1()->GetIsJITOptimizedReg();

    IR::ByteCodeUsesInstr* useCallTargetInstr = EmitFixedMethodOrFunctionObjectChecksForBuiltIns(callInstr, funcObjCheckInsertInstr, inlineeData, false, true, false, true);

    // To push function object for cases when we have to make calls to helper method to assist in inlining
    if (inlineCallOpCode == Js::OpCode::CallDirect)
    {
        IR::Instr* argoutInstr;
        StackSym *dstSym = callInstr->m_func->m_symTable->GetArgSlotSym((uint16)(1));
        argoutInstr = IR::Instr::New(Js::OpCode::ArgOut_A_InlineSpecialized, IR::SymOpnd::New(dstSym, 0, TyMachPtr, callInstr->m_func), callInstr->UnlinkSrc1(), callInstr->UnlinkSrc2(), callInstr->m_func);
        argoutInstr->SetByteCodeOffset(callInstr);
        callInstr->GetInsertBeforeByteCodeUsesInstr()->InsertBefore(argoutInstr);

        Js::BuiltinFunction builtInFunctionId = Js::JavascriptLibrary::GetBuiltInForFuncInfo(inlineeData->GetLocalFunctionId());


        callInstr->m_opcode = inlineCallOpCode;
        SetupInlineInstrForCallDirect(builtInFunctionId, callInstr, argoutInstr);

        WrapArgsOutWithCoerse(builtInFunctionId, callInstr);

        // Generate ByteCodeArgOutCaptures and move the ArgOut_A/ArgOut_A_Inline close to the call instruction
        callInstr->MoveArgs(/*generateByteCodeCapture*/ true);

        inlineBuiltInEndInstr = callInstr;
    }
    else
    {
        inlineBuiltInEndInstr = InsertInlineeBuiltInStartEndTags(callInstr, actualCount);

        // InlineArrayPop - TrackCalls Need to be done at InlineArrayPop and not at the InlineBuiltInEnd
        // Hence we use a new opcode, to detect that it is an InlineArrayPop and we don't track the call during End of inlineBuiltInCall sequence
        if (inlineCallOpCode == Js::OpCode::InlineArrayPop)
        {
            inlineBuiltInEndInstr->m_opcode = Js::OpCode::InlineNonTrackingBuiltInEnd;
        }
    }

    if (useCallTargetInstr)
    {
        useCallTargetInstr->Unlink();
        callInstr->InsertBefore(useCallTargetInstr);
    }

    if (Js::JavascriptLibrary::IsTypeSpecRequired(builtInFlags))
    {
        // Emit byteCodeUses for function object
        IR::Instr * inlineBuiltInStartInstr = inlineBuiltInEndInstr;
        while (inlineBuiltInStartInstr->m_opcode != Js::OpCode::InlineBuiltInStart)
        {
            inlineBuiltInStartInstr = inlineBuiltInStartInstr->m_prev;
        }

        IR::Opnd * tmpDst = nullptr;
        IR::Opnd * callInstrDst = callInstr->GetDst();

        if (callInstrDst && inlineCallOpCode != Js::OpCode::InlineArrayPop)
        {
            StackSym * tmpSym = StackSym::New(callInstr->GetDst()->GetType(), callInstr->m_func);
            tmpDst = IR::RegOpnd::New(tmpSym, tmpSym->GetType(), callInstr->m_func);

            callInstrDst = callInstr->UnlinkDst();
            callInstr->SetDst(tmpDst);
        }
        else
        {
            AssertMsg(inlineCallOpCode == Js::OpCode::InlineArrayPush || inlineCallOpCode == Js::OpCode::InlineArrayPop,
                "Currently Dst can be null only for InlineArrayPush/InlineArrayPop");
        }

        // Insert a byteCodeUsesInstr to make sure the function object's lifetime is extended beyond the last bailout point
        // at which we may need to call the inlinee again in the interpreter.
        useCallTargetInstr = IR::ByteCodeUsesInstr::New(callInstr->GetPrevRealInstrOrLabel());
        useCallTargetInstr->SetRemovedOpndSymbol(originalCallTargetOpndIsJITOpt, originalCallTargetStackSym->m_id);

        if (inlineCallOpCode == Js::OpCode::InlineArrayPop)
        {
            callInstr->InsertBefore(useCallTargetInstr);
        }
        else
        {
            inlineBuiltInEndInstr->InsertBefore(useCallTargetInstr);
        }

        if (tmpDst)
        {
            IR::Instr * ldInstr = IR::Instr::New(Func::GetLoadOpForType(callInstrDst->GetType()), callInstrDst, tmpDst, callInstr->m_func);
            inlineBuiltInEndInstr->InsertBefore(ldInstr);
        }

        // Set srcs of the callInstr, and process ArgOuts.
        callInstr->UnlinkSrc1();
        callInstr->UnlinkSrc2();
        callInstr->m_opcode = inlineCallOpCode;

        int argIndex = inlineCallArgCount;    // We'll use it to fill call instr srcs from upper to lower.


        IR::ByteCodeUsesInstr * byteCodeUsesInstr = IR::ByteCodeUsesInstr::New(callInstr);
        IR::Instr *argInsertInstr = inlineBuiltInStartInstr;

        inlineBuiltInEndInstr->IterateArgInstrs([&](IR::Instr* argInstr) {
            StackSym *linkSym = linkOpnd->GetStackSym();
            linkSym->m_isInlinedArgSlot = true;
            linkSym->m_allocated = true;

            // We are going to replace the use on the call (below), insert byte code use if necessary
            if (OpCodeAttr::BailOutRec(inlineCallOpCode))
            {
                StackSym * sym = argInstr->GetSrc1()->GetStackSym();
                if (sym->HasByteCodeRegSlot() && (!sym->m_isSingleDef || !sym->m_instrDef->GetSrc1() || !sym->m_instrDef->GetSrc1()->IsConstOpnd()))
                {
                    if (!sym->IsFromByteCodeConstantTable() && sym->GetByteCodeRegSlot() != callInstrDst->GetStackSym()->GetByteCodeRegSlot())
                    {
                        byteCodeUsesInstr->Set(argInstr->GetSrc1());
                    }
                }
            }

            // Convert the arg out to built in arg out, and get the src of the arg out
            IR::Opnd * argOpnd = ConvertToInlineBuiltInArgOut(argInstr);
            // Use parameter to the inline call to tempDst.
            if (argIndex == 2)
            {
                callInstr->SetSrc2(argOpnd);
                // Prevent inserting ByteCodeUses instr during globopt, as we already track the src in ArgOut.
                callInstr->GetSrc2()->SetIsJITOptimizedReg(true);
            }
            else if (argIndex == 1)
            {
                callInstr->SetSrc1(argOpnd);
                // Prevent inserting ByteCodeUses instr during globopt, as we already track the src in ArgOut.
                callInstr->GetSrc1()->SetIsJITOptimizedReg(true);
            }

            argIndex--;

            linkOpnd = argInstr->GetSrc2();

            // Move the arguments next to the call.
            argInstr->Move(argInsertInstr);
            argInsertInstr = argInstr;
            return false;
        });

        if (inlineCallOpCode == Js::OpCode::InlineMathImul || inlineCallOpCode == Js::OpCode::InlineMathClz)
        {
            // Convert:
            //     s1 = InlineMathImul s2, s3
            // Into:
            //     s4 = Or_A s2, 0
            //     s5 = Or_A s3, 0
            //     s1 = InlineMathImul s4, s5

            Func *const func = callInstr->m_func;
            IR::AddrOpnd *const zeroOpnd = IR::AddrOpnd::NewFromNumber(0, func, true);

            IR::RegOpnd *const s4 = IR::RegOpnd::New(TyVar, func);
            s4->SetIsJITOptimizedReg(true);
            IR::Instr *orInstr = IR::Instr::New(Js::OpCode::Or_A, s4, callInstr->UnlinkSrc1(), zeroOpnd, func);
            orInstr->SetByteCodeOffset(callInstr);
            callInstr->InsertBefore(orInstr);
            callInstr->SetSrc1(s4);
            if (inlineCallOpCode == Js::OpCode::InlineMathImul)
            {
                if (callInstr->GetSrc2()->IsEqual(callInstr->GetSrc1()))
                {
                    callInstr->ReplaceSrc2(s4);
                }
                else
                {
                    IR::RegOpnd *const s5 = IR::RegOpnd::New(TyVar, func);
                    s5->SetIsJITOptimizedReg(true);
                    orInstr = IR::Instr::New(Js::OpCode::Or_A, s5, callInstr->UnlinkSrc2(), zeroOpnd, func);
                    orInstr->SetByteCodeOffset(callInstr);
                    callInstr->InsertBefore(orInstr);
                    callInstr->SetSrc2(s5);
                }
            }
        }

        if (OpCodeAttr::BailOutRec(inlineCallOpCode))
        {
            inlineBuiltInEndInstr->InsertBefore(byteCodeUsesInstr);
        }

        Assert(linkOpnd->AsRegOpnd()->m_sym->GetInstrDef()->m_opcode == Js::OpCode::StartCall);
        Assert(linkOpnd->AsRegOpnd()->m_sym->GetInstrDef()->GetArgOutCount(/*getInterpreterArgOutCount*/ false) == actualCount);

        // Mark the StartCall's dst as an inlined arg slot as well so we know this is an inlined start call
        // and not adjust the stack height on x86
        linkOpnd->AsRegOpnd()->m_sym->m_isInlinedArgSlot = true;

        if (OpCodeAttr::BailOutRec(inlineCallOpCode))
        {
            callInstr = callInstr->ConvertToBailOutInstr(callInstr, IR::BailOutOnFloor);
        }
    }
    return inlineBuiltInEndInstr->m_next;
}